

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::DeepTiledOutputFile::initialize(DeepTiledOutputFile *this,Header *header)

{
  long lVar1;
  Format FVar2;
  LineOrder *pLVar3;
  TileDescription *pTVar4;
  Header *header_00;
  Compressor *pCVar5;
  size_type sVar6;
  TileBuffer *this_00;
  reference ppTVar7;
  char *__s;
  long in_RDI;
  TileOffsets *this_01;
  TileOffsets *numXTiles;
  char *p;
  size_t i;
  Compressor *compressor;
  Box2i *dataWindow;
  string *in_stack_000000c8;
  Header *in_stack_000000d0;
  undefined1 uVar8;
  TileDescription *in_stack_ffffffffffffff50;
  int **in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  int chunks;
  int *in_stack_ffffffffffffff70;
  Header *this_02;
  Header *in_stack_ffffffffffffff90;
  Header *in_stack_ffffffffffffff98;
  Header *in_stack_ffffffffffffffa0;
  int numYLevels;
  ulong uVar9;
  ulong __n;
  int in_stack_ffffffffffffffa8;
  LevelMode in_stack_ffffffffffffffac;
  TileOffsets *in_stack_ffffffffffffffb0;
  undefined8 local_28;
  undefined8 local_20;
  Box2i *local_18;
  
  Header::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Header::setType(in_stack_000000d0,in_stack_000000c8);
  pLVar3 = Header::lineOrder((Header *)0x1f4218);
  *(LineOrder *)(*(long *)(in_RDI + 8) + 0xc0) = *pLVar3;
  pTVar4 = Header::tileDescription((Header *)0x1f4235);
  lVar1 = *(long *)(in_RDI + 8);
  *(undefined8 *)(lVar1 + 0x40) = *(undefined8 *)pTVar4;
  *(undefined8 *)(lVar1 + 0x48) = *(undefined8 *)&pTVar4->mode;
  local_18 = Header::dataWindow((Header *)0x1f4259);
  *(int *)(*(long *)(in_RDI + 8) + 0xc4) = (local_18->min).x;
  *(int *)(*(long *)(in_RDI + 8) + 200) = (local_18->max).x;
  *(int *)(*(long *)(in_RDI + 8) + 0xcc) = (local_18->min).y;
  *(int *)(*(long *)(in_RDI + 8) + 0xd0) = (local_18->max).y;
  numXTiles = (TileOffsets *)(*(long *)(in_RDI + 8) + 0xe8);
  this_01 = (TileOffsets *)(*(long *)(in_RDI + 8) + 0xd4);
  header_00 = (Header *)(*(long *)(in_RDI + 8) + 0xd8);
  precalculateTileInfo
            (in_stack_ffffffffffffff50,(int)((ulong)header_00 >> 0x20),(int)header_00,
             (int)((ulong)this_01 >> 0x20),(int)this_01,(int **)numXTiles,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff70);
  chunks = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if (*(int *)(*(long *)(in_RDI + 8) + 0xc0) == 0) {
    anon_unknown_7::TileCoord::TileCoord((TileCoord *)&local_28,0,0,0,0);
  }
  else {
    anon_unknown_7::TileCoord::TileCoord
              ((TileCoord *)&local_28,0,**(int **)(*(long *)(in_RDI + 8) + 0xe8) + -1,0,0);
  }
  lVar1 = *(long *)(in_RDI + 8);
  *(undefined8 *)(lVar1 + 0x188) = local_28;
  *(undefined8 *)(lVar1 + 400) = local_20;
  Header::compression((Header *)0x1f43b3);
  pCVar5 = newTileCompressor(in_stack_ffffffffffffffac,(size_t)in_stack_ffffffffffffffa0,
                             (size_t)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  numYLevels = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  FVar2 = defaultFormat((Compressor *)this_01);
  *(Format *)(*(long *)(in_RDI + 8) + 0x118) = FVar2;
  if ((pCVar5 != (Compressor *)0x0) && (pCVar5 != (Compressor *)0x0)) {
    (*pCVar5->_vptr_Compressor[1])();
  }
  TileOffsets::TileOffsets
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
             numYLevels,(int *)in_stack_ffffffffffffff98,(int *)in_stack_ffffffffffffff90);
  TileOffsets::operator=(this_01,numXTiles);
  uVar8 = (undefined1)((ulong)this_01 >> 0x38);
  TileOffsets::~TileOffsets((TileOffsets *)0x1f4488);
  this_02 = *(Header **)(in_RDI + 8);
  getChunkOffsetTableSize(header_00,(bool)uVar8);
  Header::setChunkCount(this_02,chunks);
  *(ulong *)(*(long *)(in_RDI + 8) + 0x1b8) =
       (ulong)(uint)(*(int *)(*(long *)(in_RDI + 8) + 0x44) * *(int *)(*(long *)(in_RDI + 8) + 0x40)
                    ) << 2;
  uVar9 = 0;
  while (__n = uVar9,
        sVar6 = std::
                vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ::size((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                        *)(*(long *)(in_RDI + 8) + 0x138)), uVar9 < sVar6) {
    this_00 = (TileBuffer *)operator_new(0xb8);
    anon_unknown_7::TileBuffer::TileBuffer(this_00);
    ppTVar7 = std::
              vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                            *)(*(long *)(in_RDI + 8) + 0x138),__n);
    *ppTVar7 = this_00;
    std::
    vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
    ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x138),__n);
    Array<char>::resizeErase((Array<char> *)in_stack_ffffffffffffff50,(long)header_00);
    ppTVar7 = std::
              vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                            *)(*(long *)(in_RDI + 8) + 0x138),__n);
    __s = Array::operator_cast_to_char_((Array *)&(*ppTVar7)->ly);
    memset(__s,0,*(size_t *)(*(long *)(in_RDI + 8) + 0x1b8));
    Header::compression((Header *)0x1f45dd);
    pCVar5 = newCompressor(in_stack_ffffffffffffffac,__n,in_stack_ffffffffffffff98);
    ppTVar7 = std::
              vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                            *)(*(long *)(in_RDI + 8) + 0x138),__n);
    *(Compressor **)((long)&((*ppTVar7)->exception).field_2 + 8) = pCVar5;
    uVar9 = __n + 1;
  }
  return;
}

Assistant:

void
DeepTiledOutputFile::initialize (const Header &header)
{
    _data->header = header;
    _data->header.setType(DEEPTILE);
    _data->lineOrder = _data->header.lineOrder();

    //
    // Check that the file is indeed tiled
    //

    _data->tileDesc = _data->header.tileDescription();

    //
    // Save the dataWindow information
    //

    const Box2i &dataWindow = _data->header.dataWindow();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (_data->tileDesc,
                          _data->minX, _data->maxX,
                          _data->minY, _data->maxY,
                          _data->numXTiles, _data->numYTiles,
                          _data->numXLevels, _data->numYLevels);

    //
    // Determine the first tile coordinate that we will be writing
    // if the file is not RANDOM_Y.
    //

    _data->nextTileToWrite = (_data->lineOrder == INCREASING_Y)?
                               TileCoord (0, 0, 0, 0):
                               TileCoord (0, _data->numYTiles[0] - 1, 0, 0);

    Compressor* compressor = newTileCompressor
                                (_data->header.compression(),
                                 0,
                                 _data->tileDesc.ySize,
                                 _data->header);

    _data->format = defaultFormat (compressor);

    if (compressor != 0)
        delete compressor;

    _data->tileOffsets = TileOffsets (_data->tileDesc.mode,
                                      _data->numXLevels,
                                      _data->numYLevels,
                                      _data->numXTiles,
                                      _data->numYTiles);
                                      
    //ignore the existing value of chunkCount - correct it if it's wrong
    _data->header.setChunkCount(getChunkOffsetTableSize(_data->header));
                                      
    _data->maxSampleCountTableSize = _data->tileDesc.ySize *
                                     _data->tileDesc.xSize *
                                     sizeof(int);

                                     
    for (size_t i = 0; i < _data->tileBuffers.size(); i++)
    {
        _data->tileBuffers[i] = new TileBuffer ();

        _data->tileBuffers[i]->sampleCountTableBuffer.
                resizeErase(_data->maxSampleCountTableSize);

        char * p = &(_data->tileBuffers[i]->sampleCountTableBuffer[0]);
        memset (p, 0, _data->maxSampleCountTableSize);

        _data->tileBuffers[i]->sampleCountTableCompressor =
                newCompressor (_data->header.compression(),
                               _data->maxSampleCountTableSize,
                               _data->header);
    }
}